

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::exceptionsCatchBefore(Forth *this)

{
  Cell CVar1;
  size_type sVar2;
  Forth *this_local;
  
  CVar1 = ForthStack<unsigned_int>::stackDepth(&this->dStack);
  ForthStack<unsigned_int>::push(&this->catchStack,CVar1 - 1);
  CVar1 = ForthStack<unsigned_int>::stackDepth(&this->rStack);
  ForthStack<unsigned_int>::push(&this->catchStack,CVar1);
  CVar1 = ForthStack<unsigned_int>::stackDepth(&this->returnStack);
  ForthStack<unsigned_int>::push(&this->catchStack,CVar1);
  sVar2 = std::
          vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ::size(&this->savedInput);
  ForthStack<unsigned_int>::push(&this->catchStack,(uint)sVar2);
  ForthStack<unsigned_int>::push(&this->catchStack,this->exceptionHandler);
  CVar1 = ForthStack<unsigned_int>::stackDepth(&this->catchStack);
  this->exceptionHandler = CVar1;
  return;
}

Assistant:

void exceptionsCatchBefore(){
			catchStack.push(static_cast<Cell>(dStack.stackDepth()-1));
			catchStack.push(static_cast<Cell>(rStack.stackDepth()));
			catchStack.push(static_cast<Cell>(returnStack.stackDepth()));
			catchStack.push(CELL(savedInput.size()));
			catchStack.push(exceptionHandler);
			exceptionHandler = static_cast<Cell>(catchStack.stackDepth());
		}